

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O2

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
getMomentaDotFromForces(IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u)

{
  Matrix<double,_3,_1,_0,_3,_1> *dst;
  Index *pIVar1;
  IndexedMatrixArray *this_00;
  Index *dst_00;
  Index *fc;
  Index *tc;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *other;
  Index *dst_01;
  Index *this_01;
  Matrix3 *src;
  Matrix *pMVar2;
  Index *contactOriV;
  Vector *in_RCX;
  Index extraout_RDX;
  uint uVar3;
  long lVar4;
  uint i;
  uint uVar5;
  ulong uVar6;
  Vector VVar7;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_160;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_128;
  undefined8 local_e8;
  VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3> local_e0;
  RhsNested local_b0;
  undefined4 local_a8;
  uint uStack_a4;
  undefined4 uStack_a0;
  uint uStack_9c;
  Index *local_98;
  Index *local_90;
  Matrix<double,_3,_1,_0,_3,_1> *local_88;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_78;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_58;
  
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,in_RCX);
  uVar5 = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_128,u,0,3);
  dst = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x4a);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (dst,(Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_128);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_128,u,3,3);
  pIVar1 = &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar1,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_128);
  src = computeRotation_((IMUElasticLocalFrameDynamicalSystem *)x,(Vector3 *)pIVar1,0);
  pIVar1 = &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)pIVar1,src);
  this_00 = (IndexedMatrixArray *)(x + 0xc1);
  for (lVar4 = 0xc; lVar4 != 0x18; lVar4 = lVar4 + 6) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_128,u,lVar4,6
              );
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_160,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_128);
    IndexedMatrixArray::setValue(this_00,(Matrix *)&local_160,uVar5);
    free(local_160.m_lhs);
    uVar5 = uVar5 + 1;
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_128,u,0x18,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xcb),
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_128);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_128,u,0x1b,3);
  dst_00 = &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)dst_00,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_128);
  fc = &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  tc = &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  uVar5 = 0;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 3) {
    pMVar2 = IndexedMatrixArray::operator[](this_00,uVar5);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_128,pMVar2,0,0
              );
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_160,
               (Matrix<double,__1,_1,_0,__1,_1> *)fc,lVar4,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_160,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_128);
    pMVar2 = IndexedMatrixArray::operator[](this_00,uVar5);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_128,pMVar2,3,0
              );
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_160,
               (Matrix<double,__1,_1,_0,__1,_1> *)tc,lVar4,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_160,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)&local_128);
    uVar5 = uVar5 + 1;
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_128,u,0x1e,2);
  Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> *)&local_160,
             (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x53),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_128);
  local_e0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,_0>.m_data =
       (PointerType)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_160,
             (Scalar *)&local_e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_160);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_128,in_RCX,0,3);
  this_01 = &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_01,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_128);
  if (*(char *)((long)&x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 5) != '\0') {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_01,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x53));
  }
  uVar5 = *(uint *)((long)&x[0x13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows + 4);
  contactOriV = &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
  uVar3 = 0x33;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_128,in_RCX,
               (ulong)(uVar3 - 3),3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_160,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                *)&local_128);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)(x + 0xa2),(Matrix *)&local_160,(uint)uVar6);
    free(local_160.m_lhs);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_128,in_RCX,
               (ulong)uVar3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_160,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                *)&local_128);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)contactOriV,(Matrix *)&local_160,(uint)uVar6)
    ;
    free(local_160.m_lhs);
    uVar3 = uVar3 + 0xc;
  }
  other = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(x + 0x47);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_128,in_RCX,0x2a,
             3);
  dst_01 = &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)dst_01,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_128);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_128,in_RCX,0x2d,
             3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xf2),
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_128);
  computeContactWrench
            ((IMUElasticLocalFrameDynamicalSystem *)x,(Matrix3 *)pIVar1,dst,
             (IndexedMatrixArray *)(x + 0xa2),(IndexedMatrixArray *)contactOriV,(Vector *)fc,
             (Vector *)tc,(Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xcb),(Vector3 *)dst_00,
             (Vector3 *)dst_01,(Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xf2));
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_160,(double *)&hrp2::m,(StorageBaseType *)cst::gravity);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_128,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             &x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_160);
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3>::VectorBlock
            (&local_e0,(Matrix<double,_6,_1,_0,_6,_1> *)other,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_e0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,&local_128);
  local_98 = pIVar1;
  local_90 = this_01;
  local_88 = dst;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_b0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_98);
  local_128._56_4_ = SUB84(local_b0,0);
  local_128.m_lhs = (LhsNested)0x0;
  local_128._60_4_ = (uint)((ulong)local_b0 >> 0x20) ^ 0x80000000;
  local_128.m_rhs.m_lhs.m_rows.m_value._4_4_ = uStack_a4 ^ 0x80000000;
  local_128.m_rhs.m_lhs._12_4_ = uStack_9c ^ 0x80000000;
  local_128.m_rhs.m_lhs.m_rows.m_value._0_4_ = local_a8;
  local_128.m_rhs.m_lhs._8_4_ = uStack_a0;
  local_128.m_rhs.m_lhs.m_functor.m_other = 0.0;
  local_128.m_rhs.m_rhs = local_b0;
  local_128.m_rhs._40_4_ = local_a8;
  local_128.m_rhs._44_4_ = uStack_a4;
  local_e8 = 0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (&local_78,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_128,(double *)&hrp2::m)
  ;
  Eigen::
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
  ::Product(&local_58,&local_78,(Rhs *)cst::gravity);
  local_160.m_rhs.m_lhs.m_lhs = local_58.m_lhs.m_lhs;
  local_160.m_rhs.m_lhs.m_rhs.m_functor.m_other = local_58.m_lhs.m_rhs.m_functor.m_other;
  local_160.m_rhs.m_rhs = local_58.m_rhs;
  local_160.m_lhs =
       (LhsNested)
       &x[0xc9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3>::VectorBlock
            (&local_e0,(Matrix<double,_6,_1,_0,_6,_1> *)other,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (&local_e0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,&local_160);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,other);
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromForces(const Vector& x, const Vector& u)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        // Getting flexibility
        op_.positionFlex=x.segment(state::pos,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.rFlex = computeRotation_(op_.orientationFlexV,0);

        // Getting contact forces
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts.setValue(x.segment(state::fc+6*i,6),i);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        // Getting CoM
        op_.positionComBias <<  x.segment(state::comBias,2),
                                0;// the bias of the com along the z axis is assumed 0.
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;


        // Getting contact positions
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
          // Positions
          op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
          op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        computeContactWrench(op_.rFlex, op_.positionFlex, op_.contactPosV, op_.contactOriV,
                             fc_, tc_, op_.fm, op_.tm, op_.addForce, op_.addMoment);


        op_.momentaDot.segment<3>(0) = op_.f - hrp2::m*cst::gravity;
        op_.momentaDot.segment<3>(3) = op_.t - kine::skewSymmetric(op_.rFlex*op_.positionCom+op_.positionFlex)*hrp2::m*cst::gravity;

        return op_.momentaDot;
    }